

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryAnimationsLoader14.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::LibraryAnimationsLoader14::begin__sampler(LibraryAnimationsLoader14 *this)

{
  sampler__AttributeData *in_RSI;
  
  begin__sampler((LibraryAnimationsLoader14 *)&this[-1].super_SourceArrayLoader14.mLoader,in_RSI);
  return;
}

Assistant:

bool LibraryAnimationsLoader14::begin__sampler( const COLLADASaxFWL14::sampler__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__sampler(attributeData));
COLLADASaxFWL::sampler__AttributeData attrData;
attrData.id = attributeData.id;
attrData.pre_behavior = COLLADASaxFWL::ENUM__sampler_behavior__NOT_PRESENT;
attrData.post_behavior = COLLADASaxFWL::ENUM__sampler_behavior__NOT_PRESENT;
return mLoader->begin__sampler(attrData);
}